

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleFunctionalTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::MultisampleTextureFunctionalTestsBlittingTest::iterate
          (MultisampleTextureFunctionalTestsBlittingTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestError *this_00;
  undefined8 in_stack_fffffffffffffe18;
  undefined4 uVar6;
  undefined8 in_stack_fffffffffffffe20;
  undefined4 uVar7;
  undefined1 local_1b0 [384];
  long lVar5;
  
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_OES_texture_storage_multisample_2d_array");
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar5 + 0x6f8))(1);
  (**(code **)(lVar5 + 0x6f8))(1);
  (**(code **)(lVar5 + 0x6f8))(1,&this->src_to_color_id);
  (**(code **)(lVar5 + 0x6f8))(1,&this->src_to_depth_stencil_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not set up texture objects",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0x83);
  if (bVar2) {
    (**(code **)(lVar5 + 0xb8))(0x9102);
    uVar7 = 0;
    (**(code **)(lVar5 + 0x13a8))(0x9102,2,0x8058,4,4,4,1);
    iVar3 = 0x8e;
  }
  else {
    (**(code **)(lVar5 + 0xb8))(0x9100,this->src_to_color_id);
    (**(code **)(lVar5 + 0x1390))(0x9100,2,0x8058,4,4,1);
    iVar3 = 0x99;
  }
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"gltexStorage3DMultisample() call failed for texture object src_to_color_id"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,iVar3);
  (**(code **)(lVar5 + 0xb8))(0x9100,this->src_to_depth_stencil_id);
  (**(code **)(lVar5 + 0x1390))(0x9100,2,0x8cad,4,4,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,
                  "glTexStorage2DMultisample() call failed for texture object src_to_depth_stencil_id"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xa2);
  (**(code **)(lVar5 + 0xb8))(0xde1,this->dst_to_color_id);
  (**(code **)(lVar5 + 0x1310))
            (0xde1,0,0x8058,4,4,0,CONCAT44(uVar6,0x1908),CONCAT44(uVar7,0x1401),0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glTexImage2D() call failed for texture object dst_to_color_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xaa);
  (**(code **)(lVar5 + 0xb8))(0x8c1a,this->dst_to_depth_stencil_id);
  (**(code **)(lVar5 + 0x1320))(0x8c1a,0,0x8cad,4,4,4,0,0x84f9,0x8dad,0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glTexImage3D9) call failed for texture object dst_to_depth_stencil_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xb3);
  (**(code **)(lVar5 + 0x6d0))(1,&this->dst_fbo_id);
  (**(code **)(lVar5 + 0x6d0))(1,&this->src_fbo_id);
  (**(code **)(lVar5 + 0x78))(0x8ca9,this->dst_fbo_id);
  (**(code **)(lVar5 + 0x78))(0x8ca8,this->src_fbo_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not set up framebuffer objects",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xbb);
  if (bVar2) {
    (**(code **)(lVar5 + 0x6b8))(0x8ca8,0x8ce0,this->src_to_color_id,0,0);
  }
  else {
    (**(code **)(lVar5 + 0x6a0))(0x8ca8,0x8ce0,0x9100,this->src_to_color_id,0);
  }
  (**(code **)(lVar5 + 0x6a0))(0x8ca8,0x821a,0x9100,this->src_to_depth_stencil_id,0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not set up source framebuffer\'s attachments",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xce);
  iVar3 = (**(code **)(lVar5 + 0x170))(0x8ca8);
  if (iVar3 == 0x8cd5) {
    (**(code **)(lVar5 + 0x6a0))(0x8ca9,0x8ce0,0xde1,this->dst_to_color_id,0);
    (**(code **)(lVar5 + 0x6b8))(0x8ca9,0x821a,this->dst_to_depth_stencil_id,0,0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not set up draw framebuffer\'s attachments",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                    ,0xde);
    iVar3 = (**(code **)(lVar5 + 0x170))(0x8ca9);
    if (iVar3 == 0x8cd5) {
      (**(code **)(lVar5 + 0x140))(0,0,4,4,0,0,4,4,0x4500,0x2600);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBlitFramebuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                      ,0xf7);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Draw FBO completeness status is: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,", expected: GL_FRAMEBUFFER_COMPLETE");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Draw FBO is considered incomplete which is invalid",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
               ,0xe7);
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Source FBO completeness status is: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,", expected: GL_FRAMEBUFFER_COMPLETE");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Source FBO is considered incomplete which is invalid",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
               ,0xd7);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureFunctionalTestsBlittingTest::iterate()
{
	bool are_2d_ms_array_tos_supported =
		m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array");
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up texture objects */
	gl.genTextures(1, &dst_to_color_id);
	gl.genTextures(1, &dst_to_depth_stencil_id);
	gl.genTextures(1, &src_to_color_id);
	gl.genTextures(1, &src_to_depth_stencil_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up texture objects");

	if (are_2d_ms_array_tos_supported)
	{
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, src_to_color_id);
		gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, /* samples */
								   GL_RGBA8, 4,							   /* width */
								   4,									   /* height */
								   4,									   /* depth */
								   GL_TRUE);							   /* fixedsamplelocations */
		GLU_EXPECT_NO_ERROR(gl.getError(),
							"gltexStorage3DMultisample() call failed for texture object src_to_color_id");
	}
	else
	{
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, src_to_color_id);
		gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2, /* samples */
								   GL_RGBA8, 4,					 /* width */
								   4,							 /* height */
								   GL_TRUE);					 /* fixedsamplelocations */

		GLU_EXPECT_NO_ERROR(gl.getError(),
							"gltexStorage3DMultisample() call failed for texture object src_to_color_id");
	}

	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, src_to_depth_stencil_id);
	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2, /* samples */
							   GL_DEPTH32F_STENCIL8, 4,		 /* width */
							   4,							 /* height */
							   GL_TRUE);					 /* fixedsamplelocations */
	GLU_EXPECT_NO_ERROR(gl.getError(),
						"glTexStorage2DMultisample() call failed for texture object src_to_depth_stencil_id");

	gl.bindTexture(GL_TEXTURE_2D, dst_to_color_id);
	gl.texImage2D(GL_TEXTURE_2D, 0,					/* level */
				  GL_RGBA8, 4,						/* width */
				  4,								/* height */
				  0,								/* border */
				  GL_RGBA, GL_UNSIGNED_BYTE, NULL); /* data */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D() call failed for texture object dst_to_color_id");

	gl.bindTexture(GL_TEXTURE_2D_ARRAY, dst_to_depth_stencil_id);
	gl.texImage3D(GL_TEXTURE_2D_ARRAY, 0,									  /* level */
				  GL_DEPTH32F_STENCIL8, 4,									  /* width */
				  4,														  /* height */
				  4,														  /* depth */
				  0,														  /* border */
				  GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV, NULL); /* data */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage3D9) call failed for texture object dst_to_depth_stencil_id");

	/* Set up framebuffer objects */
	gl.genFramebuffers(1, &dst_fbo_id);
	gl.genFramebuffers(1, &src_fbo_id);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, dst_fbo_id);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, src_fbo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up framebuffer objects");

	/* Set up source FBO attachments. */
	glw::GLenum fbo_completeness_status = 0;

	if (are_2d_ms_array_tos_supported)
	{
		gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, src_to_color_id, 0, /* level */
								   0);															  /* layer */
	}
	else
	{
		gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, src_to_color_id,
								0); /* level */
	}

	gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_TEXTURE_2D_MULTISAMPLE,
							src_to_depth_stencil_id, 0); /* level */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up source framebuffer's attachments");

	fbo_completeness_status = gl.checkFramebufferStatus(GL_READ_FRAMEBUFFER);

	if (fbo_completeness_status != GL_FRAMEBUFFER_COMPLETE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Source FBO completeness status is: " << fbo_completeness_status
						   << ", expected: GL_FRAMEBUFFER_COMPLETE" << tcu::TestLog::EndMessage;

		TCU_FAIL("Source FBO is considered incomplete which is invalid");
	}

	/* Set up draw FBO attachments */
	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, dst_to_color_id, 0);   /* level */
	gl.framebufferTextureLayer(GL_DRAW_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, dst_to_depth_stencil_id, 0, /* level */
							   0);																			 /* layer */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up draw framebuffer's attachments");

	fbo_completeness_status = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

	if (fbo_completeness_status != GL_FRAMEBUFFER_COMPLETE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Draw FBO completeness status is: " << fbo_completeness_status
						   << ", expected: GL_FRAMEBUFFER_COMPLETE" << tcu::TestLog::EndMessage;

		TCU_FAIL("Draw FBO is considered incomplete which is invalid");
	}

	/* Perform the blitting operation */
	gl.blitFramebuffer(0, /* srcX0 */
					   0, /* srcY0 */
					   4, /* srcX1 */
					   4, /* srcY1 */
					   0, /* dstX0 */
					   0, /* dstY0 */
					   4, /* dstX1 */
					   4, /* dstY1 */
					   GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT,
					   GL_NEAREST); /* An INVALID_OPERATION error is generated if ...., and filter is not NEAREST. */

	/* Make sure no error was generated */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBlitFramebuffer() call failed.");

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}